

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::CFIReaderImpl::~CFIReaderImpl(CFIReaderImpl *this)

{
  CFIReaderImpl *this_local;
  
  ~CFIReaderImpl(this);
  operator_delete(this,0x230);
  return;
}

Assistant:

virtual ~CFIReaderImpl() {}